

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O1

void cleanup_sidebar(nh_bool dealloc)

{
  if (dealloc != '\0') {
    free(flooritems);
    free(inventory);
    inventory = (nh_objitem_conflict *)0x0;
    flooritems = (nh_objitem_conflict *)0x0;
  }
  delwin(objwin);
  delwin(invwin);
  invwin = (WINDOW *)0x0;
  objwin = (WINDOW *)0x0;
  return;
}

Assistant:

void cleanup_sidebar(nh_bool dealloc)
{
    if (dealloc) {
	free(flooritems);
	free(inventory);
	flooritems = inventory = NULL;
    }
    delwin(objwin);
    delwin(invwin);
    objwin = invwin = NULL;
}